

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O1

double __thiscall MetaSim::BaseStat::getVariance(BaseStat *this)

{
  double *pdVar1;
  BaseExc *pBVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (_endOfSim == '\0') {
    pBVar2 = (BaseExc *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Can\'t get statistics before end of simulation\n","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BaseStat","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"basestat.hpp","");
    BaseExc::BaseExc(pBVar2,&local_50,&local_70,&local_90);
    *(undefined ***)pBVar2 = &PTR__BaseExc_001227d8;
    __cxa_throw(pBVar2,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  if (_initFlag == '\0') {
    pBVar2 = (BaseExc *)__cxa_allocate_exception(0x30);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Statistics not initialized","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"BaseStat","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"basestat.hpp","");
    BaseExc::BaseExc(pBVar2,&local_b0,&local_d0,&local_f0);
    *(undefined ***)pBVar2 = &PTR__BaseExc_001227d8;
    __cxa_throw(pBVar2,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  if (_expNum < 3) {
    pBVar2 = (BaseExc *)__cxa_allocate_exception(0x30);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Need at least 3 run to evaluate statistic","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"BaseStat","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"basestat.hpp","");
    BaseExc::BaseExc(pBVar2,&local_110,&local_130,&local_150);
    *(undefined ***)pBVar2 = &PTR__BaseExc_001227d8;
    __cxa_throw(pBVar2,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  dVar4 = getMean(this);
  dVar5 = 0.0;
  for (pdVar1 = (this->_exper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar1 != (this->_exper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    dVar5 = dVar5 + (*pdVar1 - dVar4) * (*pdVar1 - dVar4);
  }
  lVar3 = (_expNum - 1) * _expNum;
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  dVar5 = dVar5 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  if (0.0 <= dVar5) {
    return SQRT(dVar5);
  }
  dVar4 = sqrt(dVar5);
  return dVar4;
}

Assistant:

double BaseStat::getVariance()
    {
        double sum = 0;
        double mu;		// the mean
  
        if (!_endOfSim) throw Exc(GET);
        if (!_initFlag) throw Exc(NO_INIT);
        if (_expNum < 3) throw Exc(NEED_3);

        mu = getMean();

        sum = accumulate(_exper.begin(), _exper.end(), 0.0, V(mu));
        return sqrt(sum/((_expNum - 1) * _expNum));
    }